

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::TuplePrefixPrinter<2ul>::
     PrintPrefixTo<std::tuple<unsigned_short,unsigned_char>>
               (tuple<unsigned_short,_unsigned_char> *t,ostream *os)

{
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  PrintTo((t->super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>).
          super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>.
          _M_head_impl,os);
  return;
}

Assistant:

static void PrintPrefixTo(const Tuple& t, ::std::ostream* os) {
    TuplePrefixPrinter<N - 1>::PrintPrefixTo(t, os);
    GTEST_INTENTIONAL_CONST_COND_PUSH_()
    if (N > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
      *os << ", ";
    }
    UniversalPrinter<
        typename TuplePolicy<Tuple>::template tuple_element<N - 1>::type>
        ::Print(TuplePolicy<Tuple>::template get<N - 1>(t), os);
  }